

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O1

TracedFunctions * __thiscall
wasm::TraceCalls::parseArgument
          (TracedFunctions *__return_storage_ptr__,TraceCalls *this,string *arg)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  string_view *psVar3;
  bool reuse;
  string *traceName_00;
  pointer str;
  string_view s;
  string_view sVar4;
  Split local_b8;
  string_view local_98;
  string *local_88;
  TraceCalls *local_80;
  undefined1 local_78 [8];
  string traceName;
  undefined1 local_50 [8];
  string originName;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = &originName._M_string_length;
  local_80 = this;
  traceName.field_2._8_8_ = __return_storage_ptr__;
  local_50 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,",","");
  String::Split::Split(&local_b8,arg,(string *)local_50);
  if (local_50 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_50,
                    CONCAT71(originName._M_string_length._1_7_,
                             (undefined1)originName._M_string_length) + 1);
  }
  local_88 = local_b8.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    str = local_b8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (str->_M_string_length != 0) {
        originName._M_dataplus._M_p = (pointer)0x0;
        originName._M_string_length._0_1_ = 0;
        traceName._M_dataplus._M_p = (pointer)0x0;
        traceName._M_string_length._0_1_ = 0;
        traceName_00 = (string *)local_78;
        local_78 = (undefined1  [8])&traceName._M_string_length;
        local_50 = (undefined1  [8])psVar2;
        parseFunctionName(local_80,str,(string *)local_50,traceName_00);
        sVar4._M_str = (char *)0x0;
        sVar4._M_len = (size_t)local_78;
        reuse = SUB81(traceName_00,0);
        sVar4 = IString::interned((IString *)traceName._M_dataplus._M_p,sVar4,reuse);
        s._M_str = (char *)0x0;
        s._M_len = (size_t)local_50;
        local_98 = IString::interned((IString *)originName._M_dataplus._M_p,s,reuse);
        psVar3 = (string_view *)
                 std::
                 map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                               *)traceName.field_2._8_8_,(key_type *)&local_98);
        *psVar3 = sVar4;
        if (local_78 != (undefined1  [8])&traceName._M_string_length) {
          operator_delete((void *)local_78,
                          CONCAT71(traceName._M_string_length._1_7_,
                                   (undefined1)traceName._M_string_length) + 1);
        }
        if (local_50 != (undefined1  [8])psVar2) {
          operator_delete((void *)local_50,
                          CONCAT71(originName._M_string_length._1_7_,
                                   (undefined1)originName._M_string_length) + 1);
        }
      }
      str = str + 1;
    } while (str != local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return (TracedFunctions *)traceName.field_2._8_8_;
}

Assistant:

TracedFunctions parseArgument(const std::string& arg) {
    TracedFunctions tracedFunctions;

    for (const auto& definition : String::Split(arg, ",")) {
      if (definition.empty()) {
        // Empty definition, ignore.
        continue;
      }

      std::string originName, traceName;
      parseFunctionName(definition, originName, traceName);

      tracedFunctions[Name(originName)] = Name(traceName);
    }

    return tracedFunctions;
  }